

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

Inversion * __thiscall
OpenMD::MoleculeCreator::createInversion
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,InversionStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *atom1;
  Atom *atom2;
  Atom *atom4;
  int iVar2;
  InversionType *it;
  Inversion *this_00;
  uint uVar3;
  string s;
  string local_f0;
  string local_d0;
  string local_b0;
  vector<int,_std::allocator<int>_> satellites;
  _Vector_base<double,_std::allocator<double>_> local_78;
  InversionTypeParser itParser;
  Atom *atom3;
  
  InversionTypeParser::InversionTypeParser(&itParser);
  uVar3 = stamp->center_;
  std::vector<int,_std::allocator<int>_>::vector(&satellites,&stamp->satellites_);
  if ((long)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish -
      (long)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start == 0xc) {
    ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    atom1 = ppAVar1[uVar3];
    atom2 = ppAVar1[(uint)*satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start];
    atom3 = ppAVar1[(uint)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[1]];
    atom4 = ppAVar1[(uint)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[2]];
    if (stamp->hasOverride_ == true) {
      std::__cxx11::string::string((string *)&s,(string *)&stamp->orType_);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_78,&stamp->orPars_);
      it = InversionTypeParser::parseTypeAndPars
                     (&itParser,&s,(vector<double,_std::allocator<double>_> *)&local_78);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
      std::__cxx11::string::~string((string *)&s);
      if (it == (InversionType *)0x0) goto LAB_0016e515;
    }
    else {
      (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&s,atom1);
      (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_d0,atom2);
      (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_f0);
      (*(atom4->super_StuntDouble)._vptr_StuntDouble[7])(&local_b0);
      it = ForceField::getInversionType(ff,&s,&local_d0,&local_f0,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&s);
      if (it == (InversionType *)0x0) {
        (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&s,atom1);
        (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_d0,atom2);
        (*(atom3->super_StuntDouble)._vptr_StuntDouble[7])(&local_f0);
        (*(atom4->super_StuntDouble)._vptr_StuntDouble[7])(&local_b0);
        this_00 = (Inversion *)0x0;
        snprintf(painCave.errMsg,2000,
                 "No Matching Inversion Type for[%s, %s, %s, %s]\n\t(May not be a problem: not all inversions are parametrized)\n"
                 ,s._M_dataplus._M_p,local_d0._M_dataplus._M_p,local_f0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&s);
        painCave.isFatal = 0;
        painCave.severity = 3;
        simError();
        goto LAB_0016e72f;
      }
    }
    this_00 = (Inversion *)operator_new(0xa0);
    Inversion::Inversion(this_00,atom1,atom2,atom3,atom4,it);
    uVar3 = (uint)atom3;
    iVar2 = IndexListContainer::pop(&localIndexMan->inversionIndexContainer_);
    (this_00->super_ShortRangeInteraction).localIndex_ = iVar2;
    OpenMD_itoa_abi_cxx11_
              (&s,(OpenMD *)
                  ((ulong)((long)(mol->inversions_).
                                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(mol->inversions_).
                                super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3),10,uVar3);
    Molecule::getType_abi_cxx11_(&local_b0,mol);
    std::operator+(&local_f0,&local_b0,"_Inversion_");
    std::operator+(&local_d0,&local_f0,s._M_dataplus._M_p);
    (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&s);
  }
  else {
LAB_0016e515:
    this_00 = (Inversion *)0x0;
  }
LAB_0016e72f:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&satellites.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
               *)&itParser);
  return this_00;
}

Assistant:

Inversion* MoleculeCreator::createInversion(
      ForceField* ff, Molecule* mol, InversionStamp* stamp,
      LocalIndexManager* localIndexMan) {
    InversionTypeParser itParser;
    InversionType* inversionType = NULL;
    Inversion* inversion         = NULL;

    int center                  = stamp->getCenter();
    std::vector<int> satellites = stamp->getSatellites();
    if (satellites.size() != 3) { return inversion; }

    Atom* atomA = mol->getAtomAt(center);
    Atom* atomB = mol->getAtomAt(satellites[0]);
    Atom* atomC = mol->getAtomAt(satellites[1]);
    Atom* atomD = mol->getAtomAt(satellites[2]);

    assert(atomA && atomB && atomC && atomD);

    if (stamp->hasOverride()) {
      try {
        inversionType = itParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
      } catch (OpenMDException& e) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoleculeCreator Error: %s "
                 "for molecule %s\n",
                 e.what(), mol->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }
    } else {
      inversionType = ff->getInversionType(atomA->getType(), atomB->getType(),
                                           atomC->getType(), atomD->getType());

      if (inversionType == NULL) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "No Matching Inversion Type for[%s, %s, %s, %s]\n"
            "\t(May not be a problem: not all inversions are parametrized)\n",
            atomA->getType().c_str(), atomB->getType().c_str(),
            atomC->getType().c_str(), atomD->getType().c_str());

        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
      }
    }
    if (inversionType != NULL) {
      inversion = new Inversion(atomA, atomB, atomC, atomD, inversionType);

      // set the local index of this inversion, the global index will
      // be set later
      inversion->setLocalIndex(localIndexMan->getNextInversionIndex());

      // The rule for naming an inversion is: MoleculeName_Inversion_Integer
      // The first part is the name of the molecule
      // The second part is always fixed as "Inversion"
      // The third part is the index of the inversion defined in meta-data file
      // For example, Benzene_Inversion_0 is a valid Inversion name in a
      // Benzene molecule

      std::string s = OpenMD_itoa(mol->getNInversions(), 10);
      inversion->setName(mol->getType() + "_Inversion_" + s.c_str());
      return inversion;
    } else {
      return NULL;
    }
  }